

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp.cc
# Opt level: O3

bool __thiscall fizplex::LP::is_feasible(LP *this,DVector *x)

{
  pointer pCVar1;
  bool bVar2;
  size_t *psVar3;
  double *pdVar4;
  pointer pCVar5;
  long lVar6;
  size_t column;
  size_t sVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_48;
  
  psVar3 = DVector::dimension(x);
  pCVar5 = (this->cols).
           super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (this->cols).
           super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (*psVar3 != ((long)pCVar1 - (long)pCVar5 >> 3) * -0x5555555555555555) {
    __assert_fail("x.dimension() == cols.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp.cc"
                  ,0x98,"bool fizplex::LP::is_feasible(const DVector &) const");
  }
  bVar2 = true;
  if (pCVar1 != pCVar5) {
    lVar6 = 0;
    sVar7 = 0;
    do {
      if ((*(ulong *)((long)&pCVar5->lower + lVar6) & 0x7fffffffffffffff) < 0x7ff0000000000000) {
        pdVar4 = DVector::operator[](x,sVar7);
        dVar8 = *pdVar4;
        pCVar5 = (this->cols).
                 super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        dVar10 = *(double *)((long)&pCVar5->lower + lVar6);
        if ((dVar8 < dVar10) && (1e-07 < ABS(dVar8 - dVar10))) {
          dVar9 = ABS(dVar8);
          if (ABS(dVar8) <= ABS(dVar10)) {
            dVar9 = ABS(dVar10);
          }
          if (dVar9 * 1e-06 < ABS(dVar8 - dVar10)) {
            DVector::operator[](x,sVar7);
            pCVar5 = (this->cols).
                     super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            bVar2 = false;
          }
        }
      }
      if ((*(ulong *)((long)&pCVar5->upper + lVar6) & 0x7fffffffffffffff) < 0x7ff0000000000000) {
        pdVar4 = DVector::operator[](x,sVar7);
        dVar8 = *pdVar4;
        pCVar5 = (this->cols).
                 super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        dVar10 = *(double *)((long)&pCVar5->upper + lVar6);
        if ((dVar10 < dVar8) && (1e-07 < ABS(dVar8 - dVar10))) {
          dVar9 = ABS(dVar8);
          if (ABS(dVar8) <= ABS(dVar10)) {
            dVar9 = ABS(dVar10);
          }
          if (dVar9 * 1e-06 < ABS(dVar8 - dVar10)) {
            DVector::operator[](x,sVar7);
            pCVar5 = (this->cols).
                     super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            bVar2 = false;
          }
        }
      }
      sVar7 = sVar7 + 1;
      lVar6 = lVar6 + 0x18;
    } while (sVar7 < (ulong)(((long)(this->cols).
                                    super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar5 >> 3)
                            * -0x5555555555555555));
  }
  if ((this->rows).super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->rows).super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar7 = 0;
    do {
      if ((this->cols).super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (this->cols).super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_48 = 0.0;
      }
      else {
        local_48 = 0.0;
        column = 0;
        do {
          dVar8 = ColMatrix::get_value(&this->A,sVar7,column);
          pdVar4 = DVector::operator[](x,column);
          local_48 = local_48 + dVar8 * *pdVar4;
          column = column + 1;
        } while (column < (ulong)(((long)(this->cols).
                                         super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->cols).
                                         super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      pdVar4 = DVector::operator[](&this->b,sVar7);
      dVar8 = ABS(local_48 - *pdVar4);
      if (1e-05 < dVar8) {
        dVar9 = ABS(*pdVar4);
        dVar10 = ABS(local_48);
        if (ABS(local_48) <= dVar9) {
          dVar10 = dVar9;
        }
        if (dVar10 * 0.0001 < dVar8) {
          DVector::operator[](&this->b,sVar7);
          bVar2 = false;
        }
      }
      sVar7 = sVar7 + 1;
    } while (sVar7 < (ulong)(((long)(this->rows).
                                    super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->rows).
                                    super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  return bVar2;
}

Assistant:

bool LP::is_feasible(const DVector &x) const {
  assert(x.dimension() == cols.size());
  bool feasible = true;
  for (size_t i = 0; i < cols.size(); i++) {
    if (is_finite(cols[i].lower) && is_lower_norm(x[i], cols[i].lower)) {
      Debug(0) << "Var " << i << " is below lower bound: " << x[i] << " < "
               << cols[i].lower << "\n";
      feasible = false;
    }
    if (is_finite(cols[i].upper) && is_greater_norm(x[i], cols[i].upper)) {
      Debug(0) << "Var " << i << " is above upper bound: " << x[i] << " > "
               << cols[i].upper << "\n";
      feasible = false;
    }
  }
  for (size_t row = 0; row < row_count(); row++) {
    double val = 0.0;
    for (size_t col = 0; col < column_count(); col++)
      val += A.get_value(row, col) * x[col];
    if (!is_eq_norm(val, b[row], 1e-4, 1e-5)) {
      Debug(0) << "Row " << row << " failed equality test ("
               << "should be: " << b[row] << ", is " << val << ")\n";
      feasible = false;
    }
  }
  return feasible;
}